

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

KOption getdetails(Header *h,size_t totalsize,char **fmt,size_t *psize,uint *ntoalign)

{
  int iVar1;
  KOption KVar2;
  ulong uStack_40;
  uint szmoda;
  size_t align;
  uint *puStack_30;
  KOption opt;
  uint *ntoalign_local;
  size_t *psize_local;
  char **fmt_local;
  size_t totalsize_local;
  Header *h_local;
  
  puStack_30 = ntoalign;
  ntoalign_local = (uint *)psize;
  psize_local = (size_t *)fmt;
  fmt_local = (char **)totalsize;
  totalsize_local = (size_t)h;
  align._4_4_ = getoption(h,fmt,psize);
  uStack_40 = *(ulong *)ntoalign_local;
  if ((align._4_4_ == Kpaddalign) &&
     (((*(char *)*psize_local == '\0' ||
       (KVar2 = getoption((Header *)totalsize_local,(char **)psize_local,&stack0xffffffffffffffc0),
       KVar2 == Kchar)) || (uStack_40 == 0)))) {
    luaL_argerror(*(lua_State **)totalsize_local,1,"invalid next option for option \'X\'");
  }
  if ((uStack_40 < 2) || (align._4_4_ == Kchar)) {
    *puStack_30 = 0;
  }
  else {
    if (*(uint *)(totalsize_local + 0xc) < uStack_40) {
      uStack_40 = (ulong)*(uint *)(totalsize_local + 0xc);
    }
    if ((uStack_40 & uStack_40 - 1) == 0) {
      iVar1 = (int)uStack_40;
      *puStack_30 = iVar1 - ((uint)fmt_local & iVar1 - 1U) & iVar1 - 1U;
    }
    else {
      *puStack_30 = 0;
      luaL_argerror(*(lua_State **)totalsize_local,1,"format asks for alignment not power of 2");
    }
  }
  return align._4_4_;
}

Assistant:

static KOption getdetails (Header *h, size_t totalsize, const char **fmt,
                           size_t *psize, unsigned *ntoalign) {
  KOption opt = getoption(h, fmt, psize);
  size_t align = *psize;  /* usually, alignment follows size */
  if (opt == Kpaddalign) {  /* 'X' gets alignment from following option */
    if (**fmt == '\0' || getoption(h, fmt, &align) == Kchar || align == 0)
      luaL_argerror(h->L, 1, "invalid next option for option 'X'");
  }
  if (align <= 1 || opt == Kchar)  /* need no alignment? */
    *ntoalign = 0;
  else {
    if (align > h->maxalign)  /* enforce maximum alignment */
      align = h->maxalign;
    if (l_unlikely(!ispow2(align))) {  /* not a power of 2? */
      *ntoalign = 0;  /* to avoid warnings */
      luaL_argerror(h->L, 1, "format asks for alignment not power of 2");
    }
    else {
      /* 'szmoda' = totalsize % align */
      unsigned szmoda = cast_uint(totalsize & (align - 1));
      *ntoalign = cast_uint((align - szmoda) & (align - 1));
    }
  }
  return opt;
}